

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void rtreeCheckNode(RtreeCheck *pCheck,int iDepth,u8 *aParent,i64 iNode)

{
  uint uVar1;
  uint uVar2;
  ushort uVar3;
  int iVar4;
  uint uVar5;
  float fVar6;
  Mem *pVal;
  void *__src;
  sqlite3_stmt *psVar7;
  ushort *__dest;
  i64 iKey;
  float fVar8;
  int iVar9;
  float fVar10;
  ulong uVar11;
  float fVar12;
  ulong uVar13;
  
  if (pCheck->rc != 0) {
    return;
  }
  uVar11 = (ulong)(uint)iDepth;
  psVar7 = pCheck->pGetNode;
  if (psVar7 == (sqlite3_stmt *)0x0) {
    psVar7 = rtreeCheckPrepare(pCheck,"SELECT data FROM %Q.\'%q_node\' WHERE nodeno=?",pCheck->zDb,
                               pCheck->zTab);
    pCheck->pGetNode = psVar7;
    if (pCheck->rc != 0) {
      return;
    }
  }
  sqlite3_bind_int64(psVar7,1,iNode);
  iVar4 = sqlite3_step(pCheck->pGetNode);
  if (iVar4 == 100) {
    uVar5 = sqlite3_column_bytes(pCheck->pGetNode,0);
    psVar7 = pCheck->pGetNode;
    pVal = columnMem(psVar7,0);
    __src = sqlite3_value_blob(pVal);
    columnMallocFailure(psVar7);
    iVar4 = sqlite3_initialize();
    if (iVar4 == 0) {
      __dest = (ushort *)sqlite3Malloc((long)(int)uVar5);
      if (__dest != (ushort *)0x0) {
        memcpy(__dest,__src,(long)(int)uVar5);
        goto LAB_001c96c2;
      }
    }
    pCheck->rc = 7;
  }
  uVar5 = 0;
  __dest = (ushort *)0x0;
LAB_001c96c2:
  iVar4 = sqlite3_reset(pCheck->pGetNode);
  if ((pCheck->rc == 0) && (pCheck->rc = iVar4, __dest == (ushort *)0x0 && iVar4 == 0)) {
    rtreeCheckAppendMsg(pCheck,"Node %lld missing from database",iNode);
    return;
  }
  if (__dest == (ushort *)0x0) {
    return;
  }
  if ((int)uVar5 < 4) {
    rtreeCheckAppendMsg(pCheck,"Node %lld is too small (%d bytes)",iNode,(ulong)uVar5);
  }
  else if ((aParent == (u8 *)0x0) &&
          (uVar3 = *__dest << 8 | *__dest >> 8, uVar11 = (ulong)uVar3, 0x28 < uVar3)) {
    rtreeCheckAppendMsg(pCheck,"Rtree depth out of range (%d)",uVar11);
  }
  else {
    uVar3 = __dest[1] << 8 | __dest[1] >> 8;
    if ((int)uVar5 < (int)((pCheck->nDim * 8 + 8) * (uint)uVar3 | 4)) {
      rtreeCheckAppendMsg(pCheck,"Node %lld is too small for cell count of %d (%d bytes)",iNode,
                          (ulong)uVar3,(ulong)uVar5);
    }
    else if (uVar3 != 0) {
      uVar5 = 0;
      do {
        iVar4 = pCheck->nDim;
        iVar9 = (iVar4 * 8 + 8) * uVar5;
        iKey = readInt64((u8 *)((long)__dest + (long)(iVar9 + 4)));
        if (0 < iVar4) {
          uVar13 = 0;
          do {
            uVar1 = *(uint *)((long)__dest + uVar13 * 8 + (long)iVar9 + 0xc);
            uVar2 = *(uint *)((long)__dest + uVar13 * 8 + (long)iVar9 + 0x10);
            fVar12 = (float)(uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 |
                            uVar1 << 0x18);
            fVar10 = (float)(uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 |
                            uVar2 << 0x18);
            if (pCheck->bInt == 0) {
              if (fVar10 < fVar12) goto LAB_001c9892;
            }
            else if ((int)fVar10 < (int)fVar12) {
LAB_001c9892:
              rtreeCheckAppendMsg(pCheck,"Dimension %d of cell %d on node %lld is corrupt",
                                  uVar13 & 0xffffffff,(ulong)uVar5,iNode);
            }
            if (aParent != (u8 *)0x0) {
              uVar1 = *(uint *)(aParent + uVar13 * 8);
              uVar2 = *(uint *)(aParent + uVar13 * 8 + 4);
              fVar8 = (float)(uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 |
                             uVar1 << 0x18);
              fVar6 = (float)(uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 |
                             uVar2 << 0x18);
              if (pCheck->bInt == 0) {
                if ((fVar12 < fVar8) || (fVar6 < fVar10)) goto LAB_001c990b;
              }
              else if (((int)fVar12 < (int)fVar8) || ((int)fVar6 < (int)fVar10)) {
LAB_001c990b:
                rtreeCheckAppendMsg(pCheck,
                                    "Dimension %d of cell %d on node %lld is corrupt relative to parent"
                                    ,uVar13 & 0xffffffff,(ulong)uVar5,iNode);
              }
            }
            uVar13 = uVar13 + 1;
          } while ((long)uVar13 < (long)pCheck->nDim);
        }
        if ((int)uVar11 < 1) {
          rtreeCheckMapping(pCheck,1,iKey,iNode);
          pCheck->nLeaf = pCheck->nLeaf + 1;
        }
        else {
          rtreeCheckMapping(pCheck,0,iKey,iNode);
          rtreeCheckNode(pCheck,(int)uVar11 + -1,(u8 *)((long)__dest + (long)(iVar9 + 4) + 8),iKey);
          pCheck->nNonLeaf = pCheck->nNonLeaf + 1;
        }
        uVar5 = uVar5 + 1;
      } while (uVar5 != uVar3);
    }
  }
  sqlite3_free(__dest);
  return;
}

Assistant:

static void rtreeCheckNode(
  RtreeCheck *pCheck,
  int iDepth,                     /* Depth of iNode (0==leaf) */
  u8 *aParent,                    /* Buffer containing parent coords */
  i64 iNode                       /* Node to check */
){
  u8 *aNode = 0;
  int nNode = 0;

  assert( iNode==1 || aParent!=0 );
  assert( pCheck->nDim>0 );

  aNode = rtreeCheckGetNode(pCheck, iNode, &nNode);
  if( aNode ){
    if( nNode<4 ){
      rtreeCheckAppendMsg(pCheck, 
          "Node %lld is too small (%d bytes)", iNode, nNode
      );
    }else{
      int nCell;                  /* Number of cells on page */
      int i;                      /* Used to iterate through cells */
      if( aParent==0 ){
        iDepth = readInt16(aNode);
        if( iDepth>RTREE_MAX_DEPTH ){
          rtreeCheckAppendMsg(pCheck, "Rtree depth out of range (%d)", iDepth);
          sqlite3_free(aNode);
          return;
        }
      }
      nCell = readInt16(&aNode[2]);
      if( (4 + nCell*(8 + pCheck->nDim*2*4))>nNode ){
        rtreeCheckAppendMsg(pCheck, 
            "Node %lld is too small for cell count of %d (%d bytes)", 
            iNode, nCell, nNode
        );
      }else{
        for(i=0; i<nCell; i++){
          u8 *pCell = &aNode[4 + i*(8 + pCheck->nDim*2*4)];
          i64 iVal = readInt64(pCell);
          rtreeCheckCellCoord(pCheck, iNode, i, &pCell[8], aParent);

          if( iDepth>0 ){
            rtreeCheckMapping(pCheck, 0, iVal, iNode);
            rtreeCheckNode(pCheck, iDepth-1, &pCell[8], iVal);
            pCheck->nNonLeaf++;
          }else{
            rtreeCheckMapping(pCheck, 1, iVal, iNode);
            pCheck->nLeaf++;
          }
        }
      }
    }
    sqlite3_free(aNode);
  }
}